

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Breakdown * __thiscall absl::Time::In(Breakdown *__return_storage_ptr__,Time *this,Time *param_3)

{
  int_least8_t *ct;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  uint32_t lo;
  year_t yVar9;
  Time TVar10;
  Duration DVar11;
  Time lhs;
  Time lhs_00;
  Time rhs;
  Time rhs_00;
  Duration d;
  civil_time<absl::time_internal::cctz::detail::second_tag> local_130;
  civil_time<absl::time_internal::cctz::detail::second_tag> local_120;
  weekday local_10c;
  int64_t local_108;
  uint32_t local_100;
  time_internal *local_f8;
  ulong uStack_f0;
  int64_t local_e8;
  uint32_t local_e0;
  undefined1 local_d8 [8];
  civil_day cd;
  civil_second cs;
  time_zone local_b0;
  undefined1 auStack_a8 [8];
  absolute_lookup al;
  int64_t local_78;
  duration<long,std::ratio<1l,1l>> local_70 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_68;
  time_point<seconds> local_60;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  Time *this_local;
  TimeZone tz_local;
  
  uVar1 = (this->rep_).rep_hi_;
  uVar2 = (this->rep_).rep_lo_;
  lhs.rep_.rep_lo_ = uVar2;
  lhs.rep_.rep_hi_ = uVar1;
  this_local = param_3;
  TVar10 = InfiniteFuture();
  lhs.rep_._12_4_ = 0;
  rhs.rep_._12_4_ = 0;
  rhs.rep_.rep_hi_ = SUB128(TVar10.rep_._0_12_,0);
  rhs.rep_.rep_lo_ = SUB124(TVar10.rep_._0_12_,8);
  bVar7 = absl::operator==(lhs,rhs);
  if (bVar7) {
    anon_unknown_8::InfiniteFutureBreakdown();
  }
  else {
    uVar3 = (this->rep_).rep_hi_;
    uVar4 = (this->rep_).rep_lo_;
    lhs_00.rep_.rep_lo_ = uVar4;
    lhs_00.rep_.rep_hi_ = uVar3;
    TVar10 = InfinitePast();
    tp.__d.__r = (duration)TVar10.rep_.rep_hi_;
    lhs_00.rep_._12_4_ = 0;
    rhs_00.rep_._12_4_ = 0;
    rhs_00.rep_.rep_hi_ = SUB128(TVar10.rep_._0_12_,0);
    rhs_00.rep_.rep_lo_ = SUB124(TVar10.rep_._0_12_,8);
    bVar7 = absl::operator==(lhs_00,rhs_00);
    if (bVar7) {
      anon_unknown_8::InfinitePastBreakdown();
    }
    else {
      local_68.__d.__r = (duration)anon_unknown_8::unix_epoch();
      al.abbr = (char *)(this->rep_).rep_hi_;
      uVar5 = (this->rep_).rep_hi_;
      uVar6 = (this->rep_).rep_lo_;
      DVar11.rep_lo_ = uVar6;
      DVar11.rep_hi_ = uVar5;
      DVar11._12_4_ = 0;
      local_78 = time_internal::GetRepHi(DVar11);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>(local_70,&local_78);
      local_60.__d.__r =
           (duration)
           std::chrono::operator+(&local_68,(duration<long,_std::ratio<1L,_1L>_> *)local_70);
      local_b0 = TimeZone::operator_cast_to_time_zone((TimeZone *)&this_local);
      time_internal::cctz::time_zone::lookup((absolute_lookup *)auStack_a8,&local_b0,&local_60);
      cd.f_.m = auStack_a8[0];
      cd.f_.d = auStack_a8[1];
      cd.f_.hh = auStack_a8[2];
      cd.f_.mm = auStack_a8[3];
      cd.f_.ss = auStack_a8[4];
      cd.f_._13_3_ = auStack_a8._5_3_;
      ct = &cd.f_.m;
      time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::day_tag>::
      civil_time<absl::time_internal::cctz::detail::second_tag>
                ((civil_time<absl::time_internal::cctz::detail::day_tag> *)local_d8,
                 (civil_time<absl::time_internal::cctz::detail::second_tag> *)ct,
                 (preserves_data<absl::time_internal::cctz::detail::second_tag,_absl::time_internal::cctz::detail::day_tag>
                  *)0x0);
      Breakdown::Breakdown(__return_storage_ptr__);
      yVar9 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::year((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->year = yVar9;
      iVar8 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::month((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->month = iVar8;
      iVar8 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::day((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->day = iVar8;
      iVar8 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::hour((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->hour = iVar8;
      iVar8 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::minute((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->minute = iVar8;
      iVar8 = time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>
              ::second((civil_time<absl::time_internal::cctz::detail::second_tag> *)ct);
      __return_storage_ptr__->second = iVar8;
      local_f8 = (time_internal *)(this->rep_).rep_hi_;
      uStack_f0 = *(ulong *)&(this->rep_).rep_lo_;
      d.rep_hi_ = uStack_f0 & 0xffffffff;
      d.rep_lo_ = iVar8;
      d._12_4_ = 0;
      lo = time_internal::GetRepLo(local_f8,d);
      DVar11 = time_internal::MakeDuration(0,lo);
      local_108 = DVar11.rep_hi_;
      local_100 = DVar11.rep_lo_;
      (__return_storage_ptr__->subsecond).rep_hi_ = local_108;
      (__return_storage_ptr__->subsecond).rep_lo_ = local_100;
      local_e8 = local_108;
      local_e0 = local_100;
      time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>::
      civil_time<absl::time_internal::cctz::detail::day_tag>
                (&local_120,(civil_time<absl::time_internal::cctz::detail::day_tag> *)local_d8,
                 (preserves_data<absl::time_internal::cctz::detail::second_tag,_absl::time_internal::cctz::detail::day_tag>
                  *)0x0);
      local_10c = time_internal::cctz::detail::get_weekday(&local_120);
      iVar8 = anon_unknown_8::MapWeekday(&local_10c);
      __return_storage_ptr__->weekday = iVar8;
      time_internal::cctz::detail::civil_time<absl::time_internal::cctz::detail::second_tag>::
      civil_time<absl::time_internal::cctz::detail::day_tag>
                (&local_130,(civil_time<absl::time_internal::cctz::detail::day_tag> *)local_d8,
                 (preserves_data<absl::time_internal::cctz::detail::second_tag,_absl::time_internal::cctz::detail::day_tag>
                  *)0x0);
      iVar8 = time_internal::cctz::detail::get_yearday(&local_130);
      __return_storage_ptr__->yearday = iVar8;
      __return_storage_ptr__->offset = al.cs.f_._8_4_;
      __return_storage_ptr__->is_dst = (bool)(al.cs.f_.ss & 1);
      __return_storage_ptr__->zone_abbr = (char *)al._16_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Time::Breakdown Time::In(absl::TimeZone tz) const {
  if (*this == absl::InfiniteFuture()) return InfiniteFutureBreakdown();
  if (*this == absl::InfinitePast()) return InfinitePastBreakdown();

  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(rep_));
  const auto al = cctz::time_zone(tz).lookup(tp);
  const auto cs = al.cs;
  const auto cd = cctz::civil_day(cs);

  absl::Time::Breakdown bd;
  bd.year = cs.year();
  bd.month = cs.month();
  bd.day = cs.day();
  bd.hour = cs.hour();
  bd.minute = cs.minute();
  bd.second = cs.second();
  bd.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(rep_));
  bd.weekday = MapWeekday(cctz::get_weekday(cd));
  bd.yearday = cctz::get_yearday(cd);
  bd.offset = al.offset;
  bd.is_dst = al.is_dst;
  bd.zone_abbr = al.abbr;
  return bd;
}